

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::DictVectorizer::DictVectorizer(DictVectorizer *this,DictVectorizer *from)

{
  void *pvVar1;
  Int64Vector *this_00;
  StringVector *this_01;
  Int64Vector *from_00;
  StringVector *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__DictVectorizer_003dd570;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 1) {
    clear_Map(this);
    this->_oneof_case_[0] = 1;
    this_01 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_01);
    (this->Map_).stringtoindex_ = this_01;
    if (from->_oneof_case_[0] == 1) {
      from_01 = (from->Map_).stringtoindex_;
    }
    else {
      from_01 = StringVector::default_instance();
    }
    StringVector::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 2) {
    clear_Map(this);
    this->_oneof_case_[0] = 2;
    this_00 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_00);
    (this->Map_).int64toindex_ = this_00;
    if (from->_oneof_case_[0] == 2) {
      from_00 = (from->Map_).int64toindex_;
    }
    else {
      from_00 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

DictVectorizer::DictVectorizer(const DictVectorizer& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_Map();
  switch (from.Map_case()) {
    case kStringToIndex: {
      mutable_stringtoindex()->::CoreML::Specification::StringVector::MergeFrom(from.stringtoindex());
      break;
    }
    case kInt64ToIndex: {
      mutable_int64toindex()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64toindex());
      break;
    }
    case MAP_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.DictVectorizer)
}